

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestFixturesWithThrowingDtorsAreFailures::RunImpl
          (TestFixturesWithThrowingDtorsAreFailures *this)

{
  TestResults *pTVar1;
  bool bVar2;
  Test *pTVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  char *value;
  TestDetails local_920 [2];
  TestDetails local_8e0;
  int local_8c0;
  int local_8bc;
  undefined1 local_8b8 [4];
  int failureCount;
  ScopedCurrentTest scopedResult;
  TestResults result;
  RecordingReporter reporter;
  TestDetails local_40;
  TestFixturesWithThrowingDtorsAreFailures *local_10;
  TestFixturesWithThrowingDtorsAreFailures *this_local;
  
  local_10 = this;
  pTVar3 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::throwingFixtureTestList2);
  bVar2 = UnitTest::Check<bool>(pTVar3 != (Test *)0x0);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_40,*ppTVar5,0x90);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_40,"throwingFixtureTestList2.GetHead() != NULL");
  }
  RecordingReporter::RecordingReporter((RecordingReporter *)&result.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)&scopedResult.m_oldTestDetails,(TestReporter *)&result.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_8b8,(TestResults *)&scopedResult.m_oldTestDetails,
             (TestDetails *)0x0);
  pTVar3 = UnitTest::TestList::GetHead((TestList *)(anonymous_namespace)::throwingFixtureTestList2);
  UnitTest::Test::Run(pTVar3);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_8b8);
  local_8bc = UnitTest::TestResults::GetFailedTestCount
                        ((TestResults *)&scopedResult.m_oldTestDetails);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  local_8c0 = 1;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8e0,*ppTVar5,0x9a);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8c0,&local_8bc,&local_8e0);
  value = strstr(reporter.lastFailedTest + 0xf8,"while destroying fixture");
  bVar2 = UnitTest::Check<char*>(value);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_920,*ppTVar5,0x9b);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_920,"strstr(reporter.lastFailedMessage, \"while destroying fixture\")");
  }
  RecordingReporter::~RecordingReporter((RecordingReporter *)&result.m_failureCount);
  return;
}

Assistant:

TEST(FixturesWithThrowingDtorsAreFailures)
{
	CHECK(throwingFixtureTestList2.GetHead() != NULL);

	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResult(result);
		throwingFixtureTestList2.GetHead()->Run();
	}

	int const failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK(strstr(reporter.lastFailedMessage, "while destroying fixture"));
}